

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O1

Abc_Obj_t * Abc_AigXor(Abc_Aig_t *pMan,Abc_Obj_t *p0,Abc_Obj_t *p1)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  
  pAVar1 = Abc_AigAnd(pMan,p0,(Abc_Obj_t *)((ulong)p1 ^ 1));
  pAVar2 = Abc_AigAnd(pMan,p1,(Abc_Obj_t *)((ulong)p0 ^ 1));
  pAVar1 = Abc_AigAnd(pMan,(Abc_Obj_t *)((ulong)pAVar1 ^ 1),(Abc_Obj_t *)((ulong)pAVar2 ^ 1));
  return (Abc_Obj_t *)((ulong)pAVar1 ^ 1);
}

Assistant:

Abc_Obj_t * Abc_AigXor( Abc_Aig_t * pMan, Abc_Obj_t * p0, Abc_Obj_t * p1 )
{
    return Abc_AigOr( pMan, Abc_AigAnd(pMan, p0, Abc_ObjNot(p1)), 
                            Abc_AigAnd(pMan, p1, Abc_ObjNot(p0)) );
}